

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::value_is_likely_non_uniform(Impl *impl,Value *value)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ExtractValueInst *this;
  Value *pVVar4;
  CallInst *this_00;
  uint32_t i;
  uint uVar5;
  
  while (bVar1 = LLVMBC::isa<LLVMBC::Constant>(value), !bVar1) {
    this = (ExtractValueInst *)LLVMBC::dyn_cast<LLVMBC::UnaryOperator>(value);
    if (((this == (ExtractValueInst *)0x0) &&
        (this = (ExtractValueInst *)LLVMBC::dyn_cast<LLVMBC::CastInst>(value),
        this == (ExtractValueInst *)0x0)) &&
       (this = LLVMBC::dyn_cast<LLVMBC::ExtractValueInst>(value), this == (ExtractValueInst *)0x0))
    {
      this = (ExtractValueInst *)LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(value);
      if (this == (ExtractValueInst *)0x0) {
        bVar1 = value_is_dx_op_instrinsic(value,BufferLoad);
        if (((!bVar1) && (bVar1 = value_is_dx_op_instrinsic(value,RawBufferLoad), !bVar1)) &&
           ((bVar1 = value_is_dx_op_instrinsic(value,CBufferLoad), !bVar1 &&
            (bVar1 = value_is_dx_op_instrinsic(value,CBufferLoadLegacy), !bVar1)))) {
          bVar1 = value_is_dx_op_instrinsic(value,LoadInput);
          if (bVar1) {
            return true;
          }
          bVar1 = value_is_dx_op_instrinsic(value,InstanceID);
          return bVar1;
        }
        this_00 = LLVMBC::cast<LLVMBC::CallInst>(value);
        uVar5 = 2;
        do {
          uVar3 = LLVMBC::Instruction::getNumOperands(&this_00->super_Instruction);
          bVar1 = uVar5 < uVar3;
          if (!bVar1) {
            return bVar1;
          }
          pVVar4 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,uVar5);
          bVar2 = value_is_likely_non_uniform(impl,pVVar4);
          uVar5 = uVar5 + 1;
        } while (!bVar2);
        return bVar1;
      }
      pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)this,0);
      bVar2 = value_is_likely_non_uniform(impl,pVVar4);
      if (bVar2) break;
      uVar5 = 1;
    }
    else {
      uVar5 = 0;
    }
    value = LLVMBC::Instruction::getOperand(&this->super_Instruction,uVar5);
  }
  return !bVar1;
}

Assistant:

bool value_is_likely_non_uniform(Converter::Impl &impl, const llvm::Value *value)
{
	for (;;)
	{
		// If the index is loaded from PS varying, it's almost guaranteed to be nonuniform in some way.
		// Similar with using InstanceID as bindless index.
		if (llvm::isa<llvm::Constant>(value))
			return false;
		else if (const auto *unary = llvm::dyn_cast<llvm::UnaryOperator>(value))
			value = unary->getOperand(0);
		else if (const auto *cast_op = llvm::dyn_cast<llvm::CastInst>(value))
			value = cast_op->getOperand(0);
		else if (const auto *extract_value = llvm::dyn_cast<llvm::ExtractValueInst>(value))
			value = extract_value->getOperand(0);
		else
			break;
	}

	if (const auto *binary = llvm::dyn_cast<llvm::BinaryOperator>(value))
	{
		return value_is_likely_non_uniform(impl, binary->getOperand(0)) ||
		       value_is_likely_non_uniform(impl, binary->getOperand(1));
	}
	else if (value_is_dx_op_instrinsic(value, DXIL::Op::BufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::RawBufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoadLegacy))
	{
		auto *call = llvm::cast<llvm::CallInst>(value);
		for (uint32_t i = 2; i < call->getNumOperands(); i++)
			if (value_is_likely_non_uniform(impl, call->getOperand(i)))
				return true;
		return false;
	}
	else if (value_is_dx_op_instrinsic(value, DXIL::Op::LoadInput) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::InstanceID))
	{
		return true;
	}
	else
		return false;
}